

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-design.c
# Opt level: O3

void choose_artifact_theme(artifact *art)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int16_t iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  wchar_t wVar7;
  object_kind *poVar8;
  activation *paVar9;
  long lVar10;
  wchar_t wVar11;
  char *pcVar12;
  char *pcVar13;
  _Bool _Var14;
  bool bVar15;
  int iVar16;
  
  poVar8 = lookup_kind(art->tval,art->sval);
  wVar11 = potential;
  if ((L'ᝰ' < potential) && (uVar5 = Rand_div(30000), uVar5 + L'\x01' < wVar11)) {
    iVar16 = -3;
    do {
      uVar5 = Rand_div(z_info->curse_max - 1);
      uVar6 = Rand_div(9);
      iVar4 = m_bonus(9,art->alloc_min);
      if (curses[uVar5 + L'\x01'].poss[art->tval] == true) {
        append_artifact_curse(art,uVar5 + L'\x01',uVar6 + iVar4 * 10 + L'\x01');
      }
      iVar16 = iVar16 + 1;
    } while (iVar16 != 0);
  }
  switch(poVar8->tval) {
  case L'\x05':
    uVar5 = Rand_div(100);
    uVar6 = Rand_div(9);
    art->to_d = ((short)((ulong)((long)potential * 0x64d319ff) >> 0x28) -
                (short)((long)potential * 0x64d319ff >> 0x3f)) + (short)uVar6 + art->to_d + 4;
    uVar6 = Rand_div(9);
    wVar11 = potential;
    art->to_h = ((short)((ulong)((long)potential * 0x64d319ff) >> 0x28) -
                (short)((long)potential * 0x64d319ff >> 0x3f)) + (short)uVar6 + art->to_h + 4;
    if ((int)uVar5 < 0x32) {
      get_property(art,(object *)0x0,"shooting speed",L'\x01',true);
      if ((L'ߏ' < potential) && (uVar5 = Rand_div(3), uVar5 == 0)) {
        pcVar12 = "shooting power";
LAB_0018ff51:
        get_property(art,(object *)0x0,pcVar12,L'\x01',false);
      }
    }
    else {
      if (wVar11 < L'ྠ') {
LAB_0018ff12:
        wVar11 = L'\x01';
      }
      else {
        wVar11 = L'\x02';
        uVar5 = Rand_div(2);
        if (uVar5 != 0) goto LAB_0018ff12;
      }
      get_property(art,(object *)0x0,"shooting power",wVar11,true);
      if ((L'ࣉ' < potential) && (uVar5 = Rand_div(3), uVar5 == 0)) {
        pcVar12 = "shooting speed";
        goto LAB_0018ff51;
      }
    }
    wVar11 = potential;
    uVar5 = Rand_div(5000);
    if ((uVar5 + L'\x01' < wVar11) && (uVar5 = Rand_div(3), uVar5 != 0)) {
      uVar5 = Rand_div(2);
      pcVar12 = "RAND_BRAND_MISSILE";
      if (uVar5 == 0) {
        pcVar12 = "RAND_SUPER_SHOOTING";
      }
      paVar9 = lookup_activation(pcVar12);
      art->activation = paVar9;
    }
    if (potential < L'Ϩ') {
      potential = L'Ϩ';
    }
    break;
  default:
    msg("error -- object kind not recognized.");
    break;
  case L'\a':
  case L'\b':
  case L'\t':
    choose_melee_weapon_theme(art);
    break;
  case L'\n':
    uVar5 = Rand_div(100);
    uVar6 = Rand_div(5);
    wVar11 = potential;
    art->to_a = ((short)(uint)((ulong)((long)potential * 0x57619f1) >> 0x25) -
                (short)((long)potential * 0x57619f1 >> 0x3f)) + (short)uVar6 + art->to_a + 7;
    if ((int)uVar5 < 0x19) {
      if (L'ᆓ' < wVar11) {
        iVar16 = damroll(3,2);
        wVar11 = iVar16 + L'\x05';
        pcVar12 = "speed";
        _Var14 = true;
LAB_00191013:
        get_property(art,(object *)0x0,pcVar12,wVar11,_Var14);
      }
    }
    else if (uVar5 < 0x23) {
      uVar5 = Rand_div(5);
      get_property(art,(object *)0x0,"nexus resistance",uVar5 * 5 + L'#',true);
      get_property(art,(object *)0x0,"feather falling",L'\0',true);
      uVar5 = Rand_div(5);
      if (uVar5 == 0) {
        wVar11 = lookup_curse("anti-teleportation");
        uVar5 = Rand_div(0x14);
        append_artifact_curse(art,wVar11,uVar5 + L'(');
        potential = potential + L'Ĭ';
      }
    }
    else {
      if (0x31 < uVar5) {
        if (uVar5 < 0x3c) {
          uVar5 = Rand_div(2);
          if (uVar5 == 0) {
            pcVar12 = "RAND_HEAL1";
            if (L'ஷ' < potential) {
              pcVar12 = "RAND_HEAL2";
            }
            pcVar13 = "RAND_HEAL3";
            if (potential < L'ᕼ') {
              pcVar13 = pcVar12;
            }
            paVar9 = lookup_activation(pcVar13);
            art->activation = paVar9;
          }
          get_property(art,(object *)0x0,"regeneration",L'\0',true);
          uVar5 = Rand_div(4);
          get_property(art,(object *)0x0,"extra moves",(uint)(uVar5 == 0) + L'\x01',true);
          uVar5 = Rand_div(4);
          wVar11 = uVar5 + L'\x01';
          pcVar12 = "constitution";
        }
        else if (uVar5 < 0x46) {
          uVar5 = Rand_div(3);
          if ((uVar5 != 0) && (L'ৃ' < potential)) {
            paVar9 = lookup_activation("RAND_STORM_DANCE");
            art->activation = paVar9;
          }
          get_property(art,(object *)0x0,"feather falling",L'\0',true);
          uVar5 = Rand_div(4);
          wVar11 = uVar5 + L'\x01';
          pcVar12 = "dexterity";
        }
        else {
          if (0x4f < uVar5) goto LAB_00191018;
          uVar5 = Rand_div(3);
          if (uVar5 != 0) {
            paVar9 = lookup_activation("RAND_DETECT_MONSTERS");
            art->activation = paVar9;
          }
          get_property(art,(object *)0x0,"regeneration",L'\0',true);
          get_property(art,(object *)0x0,"slow digestion",L'\0',true);
          uVar5 = Rand_div(6);
          if (uVar5 == 0) {
            get_property(art,(object *)0x0,"telepathy",L'\0',false);
          }
          uVar5 = Rand_div(4);
          wVar11 = uVar5 + L'\x01';
          pcVar12 = "stealth";
        }
        _Var14 = false;
        goto LAB_00191013;
      }
      pcVar12 = "RAND_TELEPORT1";
      if (L'ߏ' < wVar11) {
        pcVar12 = "RAND_TELEPORT2";
      }
      pcVar13 = "RAND_RECALL";
      if (wVar11 < L'ྠ') {
        pcVar13 = pcVar12;
      }
      paVar9 = lookup_activation(pcVar13);
      art->activation = paVar9;
      potential = (potential * 2) / 3;
      uVar5 = Rand_div(5);
      get_property(art,(object *)0x0,"nexus resistance",uVar5 * 5 + L'#',true);
      get_property(art,(object *)0x0,"trap immunity",L'\0',true);
      if (L'ϧ' < potential) {
        uVar5 = Rand_div(4);
        get_property(art,(object *)0x0,"dexterity",uVar5 + L'\x01',false);
      }
      uVar5 = Rand_div(5);
      if (uVar5 == 0) {
        wVar11 = lookup_curse("teleportation");
        uVar5 = Rand_div(0x14);
        append_artifact_curse(art,wVar11,uVar5 + L'(');
        potential = potential + L'd';
      }
    }
LAB_00191018:
    uVar5 = Rand_div(4);
    if (((uVar5 != 0) || (art->activation != (activation *)0x0)) || (potential < L'ߐ')) break;
    pcVar12 = "RAND_SPEED";
LAB_0019104f:
    paVar9 = lookup_activation(pcVar12);
    art->activation = paVar9;
    break;
  case L'\v':
    uVar5 = Rand_div(100);
    uVar6 = Rand_div(5);
    wVar11 = potential;
    art->to_a = ((short)(uint)((ulong)((long)potential * 0x57619f1) >> 0x25) -
                (short)((long)potential * 0x57619f1 >> 0x3f)) + (short)uVar6 + art->to_a + 8;
    if ((int)uVar5 < 0x1e) {
      uVar5 = Rand_div(4);
      get_property(art,(object *)0x0,"skill bonus",uVar5 + L'\a',true);
      get_property(art,(object *)0x0,"deadliness bonus",uVar5 + L'\a',true);
      uVar5 = Rand_div(3);
      if (uVar5 != 0) {
        get_property(art,(object *)0x0,"free action",L'\0',true);
      }
      uVar5 = Rand_div(6);
      if (uVar5 != 0) break;
      uVar5 = Rand_div(3);
      wVar11 = ~uVar5;
      pcVar12 = "stealth";
      goto LAB_0018fdb5;
    }
    if (uVar5 < 0x2d) {
      get_property(art,(object *)0x0,"protection from fear",L'\0',true);
      uVar5 = Rand_div(3);
      if (uVar5 != 0) {
        get_property(art,(object *)0x0,"regeneration",L'\0',false);
      }
      uVar5 = Rand_div(2);
      if (uVar5 == 0) {
        get_property(art,(object *)0x0,"free action",L'\0',false);
      }
      uVar5 = Rand_div(3);
      if (uVar5 == 0) {
        uVar5 = Rand_div(4);
        pcVar12 = "strength";
      }
      else {
        uVar6 = Rand_div(2);
        uVar5 = Rand_div(4);
        if (uVar6 == 0) {
          pcVar12 = "dexterity";
        }
        else {
          pcVar12 = "constitution";
        }
      }
      get_property(art,(object *)0x0,pcVar12,uVar5 + L'\x01',false);
      if ((L'כ' < potential) && (uVar5 = Rand_div(4), uVar5 != 0)) {
        uVar5 = Rand_div(4);
        get_property(art,(object *)0x0,"deadliness bonus",uVar5 + L'\x05',false);
        get_property(art,(object *)0x0,"skill bonus",uVar5 + L'\x05',false);
      }
      uVar5 = Rand_div(6);
      if (uVar5 != 0) break;
      uVar5 = Rand_div(6);
      wVar11 = uVar5 * -5 + L'\xfffffffb';
      goto LAB_0018f6e0;
    }
    if (uVar5 < 0x3c) {
      uVar5 = Rand_div(4);
      get_property(art,(object *)0x0,"armor bonus",uVar5 + L'\x05',false);
      bVar3 = true;
      do {
        bVar15 = bVar3;
        uVar5 = Rand_div(4);
        if (uVar5 == 0) {
          bVar2 = false;
          pcVar12 = "fire resistance";
          bVar3 = false;
LAB_0019057f:
          bVar1 = false;
LAB_00190582:
          uVar6 = Rand_div(5);
          get_property(art,(object *)0x0,pcVar12,uVar6 * 5 + L'#',true);
        }
        else {
          if (uVar5 == 1) {
            bVar2 = false;
            bVar3 = true;
            pcVar12 = "cold resistance";
            goto LAB_0019057f;
          }
          if (uVar5 == 3) {
            bVar2 = true;
            bVar3 = false;
            pcVar12 = "electricity resistance";
            goto LAB_0019057f;
          }
          bVar2 = false;
          bVar3 = false;
          bVar1 = false;
          if (uVar5 == 2) {
            bVar1 = true;
            bVar2 = false;
            pcVar12 = "acid resistance";
            bVar3 = false;
            goto LAB_00190582;
          }
        }
        if ((L'ǳ' < potential) && (uVar6 = Rand_div(3), uVar6 != 0)) {
          if (uVar5 == 0) {
            paVar9 = lookup_activation("RAND_FIRE1");
            art->activation = paVar9;
          }
          if (bVar3) {
            paVar9 = lookup_activation("RAND_COLD1");
            art->activation = paVar9;
          }
          if (bVar1) {
            paVar9 = lookup_activation("RAND_ACID1");
            art->activation = paVar9;
          }
          if (bVar2) {
            paVar9 = lookup_activation("RAND_ELEC1");
            art->activation = paVar9;
          }
        }
        bVar3 = false;
      } while (bVar15);
      break;
    }
    if (uVar5 < 0x4b) {
      paVar9 = lookup_activation("RAND_DISARM");
      art->activation = paVar9;
      uVar5 = Rand_div(4);
      get_property(art,(object *)0x0,"stealth",uVar5 + L'\x01',false);
      uVar5 = Rand_div(4);
      get_property(art,(object *)0x0,"searching skill",uVar5 + L'\x01',false);
      uVar5 = Rand_div(3);
      if (uVar5 != 0) {
        get_property(art,(object *)0x0,"free action",L'\0',false);
      }
      uVar5 = Rand_div(5);
      if (uVar5 != 0) break;
      uVar5 = Rand_div(6);
      wVar11 = uVar5 * -5 + L'\xfffffffb';
      goto LAB_0018fab7;
    }
    if (uVar5 < 0x5a) {
      uVar5 = Rand_div(4);
      get_property(art,(object *)0x0,"magic mastery",uVar5 + L'\x01',false);
      pcVar12 = "trap immunity";
    }
    else {
      if (L'ණ' < wVar11 || 99 < uVar5) break;
      paVar9 = lookup_activation("RAND_SUPER_SHOOTING");
      art->activation = paVar9;
      potential = potential + L'\xfffffd12';
      uVar5 = Rand_div(5);
      get_property(art,(object *)0x0,"deadliness bonus",uVar5 + L'\x06',false);
      get_property(art,(object *)0x0,"skill bonus",uVar5 + L'\x06',false);
      uVar5 = Rand_div(3);
      if (uVar5 == 0) break;
      pcVar12 = "free action";
    }
LAB_0018f74d:
    wVar11 = L'\0';
    goto LAB_001900f6;
  case L'\f':
  case L'\r':
    uVar5 = Rand_div(100);
    uVar6 = Rand_div(6);
    wVar11 = potential;
    art->to_a = ((short)(uint)((ulong)((long)potential * 0x57619f1) >> 0x25) -
                (short)((long)potential * 0x57619f1 >> 0x3f)) + (short)uVar6 + art->to_a + 9;
    if ((int)uVar5 < 0x18) {
      if (L'ණ' < wVar11) break;
      pcVar12 = "telepathy";
      goto LAB_0018f74d;
    }
    if (uVar5 < 0x23) {
      uVar5 = Rand_div(2);
      if ((uVar5 == 0) && (L'ᆓ' < potential)) {
        paVar9 = lookup_activation("RAND_CURE");
        art->activation = paVar9;
      }
      get_property(art,(object *)0x0,"protection from confusion",L'\0',false);
      uVar5 = Rand_div(5);
      wVar11 = uVar5 * 5 + L'#';
LAB_0018fab7:
      pcVar12 = "sound resistance";
    }
    else if (uVar5 < 0x2e) {
      uVar5 = Rand_div(3);
      if (uVar5 != 0) {
        pcVar12 = "RAND_DETECT_D_S_T";
        if (L'ລ' < potential) {
          pcVar12 = "RAND_DETECT_ALL";
        }
        paVar9 = lookup_activation(pcVar12);
        art->activation = paVar9;
      }
      get_property(art,(object *)0x0,"protection from blindness",L'\0',false);
      get_property(art,(object *)0x0,"see invisible",L'\0',false);
      uVar5 = Rand_div(2);
      if (uVar5 == 0) {
        get_property(art,(object *)0x0,"darkness",L'\0',false);
      }
      uVar5 = Rand_div(4);
      wVar11 = uVar5 + L'\x01';
      pcVar12 = "searching skill";
    }
    else {
      if (0x38 < uVar5) {
        if (uVar5 < 0x44) {
          if ((wVar11 < L'ৄ') || (uVar5 = Rand_div(3), uVar5 == 0)) {
            pcVar12 = "RAND_HEROISM";
          }
          else {
            pcVar12 = "RAND_FRIGHTEN_ALL";
          }
          paVar9 = lookup_activation(pcVar12);
          art->activation = paVar9;
          get_property(art,(object *)0x0,"protection from fear",L'\0',false);
          uVar5 = Rand_div(4);
          get_property(art,(object *)0x0,"strength",uVar5 + L'\x01',false);
          uVar5 = Rand_div(4);
          get_property(art,(object *)0x0,"dexterity",uVar5 + L'\x01',false);
          get_property(art,(object *)0x0,"sustain dexterity",L'\0',true);
          pcVar12 = "sustain strength";
          wVar11 = L'\0';
          goto LAB_0018fdb5;
        }
        if (0x4e < uVar5) {
          if ((0x59 < uVar5) || (uVar5 = Rand_div(3), uVar5 == 0)) break;
          pcVar12 = "RAND_HEAL1";
          if (L'ৃ' < potential) {
            pcVar12 = "RAND_HEAL2";
          }
          pcVar13 = "RAND_HEAL3";
          if (potential < L'ྠ') {
            pcVar13 = pcVar12;
          }
          paVar9 = lookup_activation(pcVar13);
          art->activation = paVar9;
          pcVar12 = "regeneration";
          goto LAB_0018f74d;
        }
        if (L'ৃ' < wVar11) break;
        pcVar12 = "RAND_IDENTIFY";
        goto LAB_0019104f;
      }
      uVar5 = Rand_div(4);
      get_property(art,(object *)0x0,"wisdom",uVar5 + L'\x01',false);
      uVar5 = Rand_div(3);
      if (uVar5 != 0) break;
      uVar5 = Rand_div(2);
      wVar11 = uVar5 + L'\x03';
      pcVar12 = "extra armor";
    }
    goto LAB_001900f6;
  case L'\x0e':
    uVar5 = Rand_div(100);
    uVar6 = Rand_div(8);
    wVar11 = potential;
    art->to_a = ((short)(uint)((ulong)((long)potential * 0x57619f1) >> 0x25) -
                (short)((long)potential * 0x57619f1 >> 0x3f)) + (short)uVar6 + art->to_a + 9;
    if (0x11 < (int)uVar5) {
      if (uVar5 < 0x1e) {
        uVar5 = Rand_div(4);
        get_property(art,(object *)0x0,"constitution",uVar5 + L'\x01',false);
        uVar5 = Rand_div(4);
        wVar11 = uVar5 + L'\x01';
        pcVar12 = "strength";
        goto LAB_001900f6;
      }
      if (uVar5 < 0x2d) {
        uVar5 = Rand_div(5);
        get_property(art,(object *)0x0,"shards resistance",uVar5 * 5 + L'#',true);
        uVar5 = Rand_div(3);
        wVar11 = potential / 0x4b0 + uVar5 + L'\x01';
        pcVar12 = "extra armor";
      }
      else if (uVar5 < 0x37) {
        uVar5 = Rand_div(5);
        get_property(art,(object *)0x0,"light resistance",uVar5 * 5 + L'#',true);
        uVar5 = Rand_div(5);
        wVar11 = uVar5 * 5 + L'#';
        pcVar12 = "dark resistance";
      }
      else {
        if (uVar5 < 0x55) {
          uVar5 = Rand_div(3);
          if ((uVar5 == 0) && (L'ྟ' < potential)) {
            paVar9 = lookup_activation("RAND_SHIELD");
            art->activation = paVar9;
          }
          uVar5 = Rand_div(6);
          get_property(art,(object *)0x0,"armor bonus",potential / 2000 + uVar5 + L'\x01',true);
          uVar5 = Rand_div(4);
          if (uVar5 == 0) {
            get_property(art,(object *)0x0,"regeneration",L'\0',false);
          }
          uVar5 = Rand_div(4);
          if (uVar5 == 0) {
            get_property(art,(object *)0x0,"feather falling",L'\0',false);
          }
          uVar5 = Rand_div(4);
          if (uVar5 == 0) {
            get_property(art,(object *)0x0,"hold life",L'\0',false);
          }
          uVar5 = Rand_div(4);
          if (uVar5 == 0) {
            get_property(art,(object *)0x0,"see invisible",L'\0',false);
          }
          uVar5 = Rand_div(4);
          if (uVar5 == 0) {
            get_property(art,(object *)0x0,"free action",L'\0',false);
          }
          uVar5 = Rand_div(4);
          if (uVar5 == 0) {
            get_property(art,(object *)0x0,"protection from blindness",L'\0',false);
          }
          uVar5 = Rand_div(4);
          if (uVar5 == 0) {
            get_property(art,(object *)0x0,"protection from confusion",L'\0',false);
          }
          uVar5 = Rand_div(4);
          if (uVar5 != 0) break;
          pcVar12 = "protection from stunning";
          goto LAB_0018f74d;
        }
        if (wVar11 < L'ᎈ' || 99 < uVar5) break;
        uVar5 = Rand_div(4);
        switch(uVar5) {
        case 0:
          pcVar12 = "fire resistance";
          break;
        case 1:
          pcVar12 = "cold resistance";
          break;
        case 2:
          pcVar12 = "acid resistance";
          break;
        case 3:
          pcVar12 = "electricity resistance";
          break;
        default:
          goto switchD_00191248_default;
        }
        wVar11 = L'd';
      }
      goto LAB_0018fdb5;
    }
    uVar5 = Rand_div(3);
    if (L'ஷ' < potential && uVar5 == 0) {
      pcVar12 = "RAND_RESIST_ELEMENTS";
      if (0x157b < (uint)potential) {
        pcVar12 = "RAND_RESIST_ALL";
      }
      paVar9 = lookup_activation(pcVar12);
      art->activation = paVar9;
    }
    uVar5 = Rand_div(5);
    if (uVar5 != 0) {
      uVar5 = Rand_div(5);
      get_property(art,(object *)0x0,"acid resistance",uVar5 * 5 + L'#',true);
    }
    uVar5 = Rand_div(5);
    if (uVar5 != 0) {
      uVar5 = Rand_div(5);
      get_property(art,(object *)0x0,"electricity resistance",uVar5 * 5 + L'#',true);
    }
    uVar5 = Rand_div(5);
    if (uVar5 != 0) {
      uVar5 = Rand_div(5);
      get_property(art,(object *)0x0,"fire resistance",uVar5 * 5 + L'#',true);
    }
    uVar5 = Rand_div(5);
    if (uVar5 == 0) break;
LAB_0018fd99:
    uVar5 = Rand_div(5);
    wVar11 = uVar5 * 5 + L'#';
    pcVar12 = "cold resistance";
LAB_0018fdb5:
    _Var14 = true;
    goto LAB_001900f9;
  case L'\x0f':
    uVar5 = Rand_div(100);
    uVar6 = Rand_div(6);
    art->to_a = ((short)(uint)((ulong)((long)potential * 0x57619f1) >> 0x25) -
                (short)((long)potential * 0x57619f1 >> 0x3f)) + (short)uVar6 + art->to_a + 9;
    if ((int)uVar5 < 0x14) {
      uVar5 = Rand_div(2);
      if (uVar5 == 0) {
        paVar9 = lookup_activation("RAND_SLEEP_FOES");
        art->activation = paVar9;
      }
      uVar5 = Rand_div(4);
      pcVar12 = "stealth";
LAB_0018fb44:
      wVar11 = uVar5 + L'\x01';
LAB_0018fb49:
      _Var14 = false;
LAB_0018fb4c:
      get_property(art,(object *)0x0,pcVar12,wVar11,_Var14);
    }
    else if (uVar5 < 0x1e) {
      uVar5 = Rand_div(2);
      if (uVar5 == 0) {
        uVar5 = Rand_div(2);
        if (uVar5 == 0) {
          pcVar12 = "RAND_CONFU_FOES";
        }
        else {
          pcVar12 = "RAND_TURN_FOES";
        }
LAB_001912f2:
        paVar9 = lookup_activation(pcVar12);
        art->activation = paVar9;
      }
    }
    else if (uVar5 < 0x28) {
      uVar5 = Rand_div(4);
      if ((uVar5 == 0) && (L'ஷ' < potential)) {
        paVar9 = lookup_activation("RAND_SHIELD");
        art->activation = paVar9;
      }
      uVar5 = Rand_div(3);
      get_property(art,(object *)0x0,"armor bonus",potential / 0x640 + uVar5 + L'\x01',true);
      uVar5 = Rand_div(3);
      get_property(art,(object *)0x0,"extra armor",potential / 0x640 + uVar5 + L'\x01',true);
      uVar5 = Rand_div(3);
      if (uVar5 == 0) {
        uVar5 = Rand_div(5);
        wVar11 = uVar5 + L'\x04';
        pcVar12 = "damage reduction";
        _Var14 = true;
        goto LAB_0018fb4c;
      }
    }
    else {
      if (uVar5 < 0x32) {
        uVar5 = Rand_div(2);
        if (uVar5 == 0) {
          pcVar12 = "RAND_DETECT_MONSTERS";
        }
        else {
          pcVar12 = "RAND_DETECT_EVIL";
        }
        goto LAB_001912f2;
      }
      if (uVar5 < 0x3c) {
        uVar5 = Rand_div(3);
        if (uVar5 != 0) {
          if ((potential < L'ྠ') || (uVar5 = Rand_div(3), uVar5 == 0)) {
            if (potential < L'ஸ') {
              pcVar12 = "RAND_DETECT_D_S_T";
            }
            else {
              pcVar12 = "RAND_MAGIC_MAP";
            }
          }
          else {
            pcVar12 = "RAND_DETECT_ALL";
          }
          paVar9 = lookup_activation(pcVar12);
          art->activation = paVar9;
        }
        uVar5 = Rand_div(4);
        pcVar12 = "searching skill";
        goto LAB_0018fb44;
      }
      if (uVar5 < 0x41) {
        uVar5 = Rand_div(3);
        uVar6 = Rand_div(2);
        if (uVar6 == 0) {
          paVar9 = lookup_activation("RAND_SLOW_FOES");
          art->activation = paVar9;
        }
        if (uVar5 < 3) {
          iVar16 = *(int *)(&DAT_0022dd7c + (ulong)uVar5 * 4);
          uVar5 = Rand_div(5);
          get_property(art,(object *)0x0,&DAT_0022dd7c + iVar16,uVar5 * 5 + L'#',false);
        }
        uVar5 = Rand_div(4);
        get_property(art,(object *)0x0,"infravision",uVar5 + L'\x01',false);
        uVar5 = Rand_div(6);
        if (uVar5 == 0) {
          uVar5 = Rand_div(2);
          wVar11 = ~uVar5;
          pcVar12 = "magic mastery";
          goto LAB_0018fb49;
        }
      }
    }
    wVar11 = art->sval;
    wVar7 = lookup_sval(L'\x0f',"Elven Cloak");
    if (wVar11 == wVar7) {
      lVar10 = (long)potential;
      uVar5 = Rand_div(2);
      art->modifiers[5] =
           (short)uVar5 +
           ((short)(uint)((ulong)(lVar10 * 0x68db8bad) >> 0x2a) -
           (short)(lVar10 * 0x68db8bad >> 0x3f)) + art->modifiers[5] + 1;
    }
    break;
  case L'\x10':
  case L'\x11':
  case L'\x12':
    uVar5 = Rand_div(100);
    uVar6 = Rand_div(8);
    wVar11 = potential;
    art->to_a = ((short)(uint)((ulong)((long)potential * 0x57619f1) >> 0x25) -
                (short)((long)potential * 0x57619f1 >> 0x3f)) + (short)uVar6 + art->to_a + 0xb;
    if ((int)uVar5 < 0x1e) {
      uVar5 = Rand_div(2);
      if (L'ஷ' < potential && uVar5 == 0) {
        pcVar12 = "RAND_RESIST_ELEMENTS";
        if (0x157b < (uint)potential) {
          pcVar12 = "RAND_RESIST_ALL";
        }
        paVar9 = lookup_activation(pcVar12);
        art->activation = paVar9;
      }
      uVar5 = Rand_div(5);
      if (uVar5 != 0) {
        uVar5 = Rand_div(5);
        get_property(art,(object *)0x0,"acid resistance",uVar5 * 5 + L'#',true);
      }
      uVar5 = Rand_div(5);
      if (uVar5 != 0) {
        uVar5 = Rand_div(5);
        get_property(art,(object *)0x0,"electricity resistance",uVar5 * 5 + L'#',true);
      }
      uVar5 = Rand_div(5);
      if (uVar5 != 0) {
        uVar5 = Rand_div(5);
        get_property(art,(object *)0x0,"fire resistance",uVar5 * 5 + L'#',true);
      }
      uVar5 = Rand_div(5);
      if (uVar5 != 0) {
        uVar5 = Rand_div(5);
        get_property(art,(object *)0x0,"cold resistance",uVar5 * 5 + L'#',true);
      }
      uVar5 = Rand_div(2);
      if ((uVar5 != 0) || (potential < L'ߐ')) break;
      uVar5 = Rand_div(5);
      wVar11 = uVar5 * 5 + L'#';
LAB_0018f6e0:
      pcVar12 = "poison resistance";
      goto LAB_001900f6;
    }
    if (uVar5 < 0x28) {
      if (L'ᕻ' < wVar11) {
        uVar5 = Rand_div(3);
        if (uVar5 != 0) {
          uVar5 = Rand_div(2);
          pcVar12 = "RAND_REGAIN";
          if (uVar5 == 0) {
            pcVar12 = "RAND_HEAL3";
          }
          paVar9 = lookup_activation(pcVar12);
          art->activation = paVar9;
        }
        uVar5 = Rand_div(5);
        get_property(art,(object *)0x0,"nether resistance",uVar5 * 5 + L'#',false);
        get_property(art,(object *)0x0,"hold life",L'\0',false);
        uVar5 = Rand_div(2);
        if (uVar5 == 0) {
          uVar5 = Rand_div(5);
          wVar11 = uVar5 * 5 + L'#';
          pcVar12 = "chaos resistance";
          goto LAB_0018fcdc;
        }
      }
LAB_0018fce4:
      uVar5 = Rand_div(5);
      if ((int)uVar5 < 2) {
        uVar5 = Rand_div(5);
        get_property(art,(object *)0x0,"acid resistance",uVar5 * 5 + L'#',true);
      }
      uVar5 = Rand_div(5);
      if ((int)uVar5 < 2) {
        uVar5 = Rand_div(5);
        get_property(art,(object *)0x0,"electricity resistance",uVar5 * 5 + L'#',true);
      }
      uVar5 = Rand_div(5);
      if ((int)uVar5 < 2) {
        uVar5 = Rand_div(5);
        get_property(art,(object *)0x0,"fire resistance",uVar5 * 5 + L'#',true);
      }
      uVar5 = Rand_div(5);
      if (1 < (int)uVar5) break;
      goto LAB_0018fd99;
    }
    if (uVar5 < 0x32) {
      uVar5 = Rand_div(5);
      get_property(art,(object *)0x0,"sound resistance",uVar5 * 5 + L'#',false);
      pcVar12 = "protection from confusion";
      wVar11 = L'\0';
LAB_0018fcdc:
      _Var14 = false;
LAB_0018fcdf:
      get_property(art,(object *)0x0,pcVar12,wVar11,_Var14);
      goto LAB_0018fce4;
    }
    if (uVar5 < 0x3e) {
      uVar5 = Rand_div(3);
      if ((uVar5 == 0) && (L'ྟ' < potential)) {
        paVar9 = lookup_activation("RAND_SHIELD");
        art->activation = paVar9;
      }
      uVar5 = Rand_div(3);
      get_property(art,(object *)0x0,"armor bonus",potential / 0x640 + uVar5 + L'\x01',true);
      uVar5 = Rand_div(3);
      get_property(art,(object *)0x0,"extra armor",potential / 0x640 + uVar5 + L'\x01',true);
      uVar5 = Rand_div(3);
      if (uVar5 != 0) {
        uVar5 = Rand_div(10);
        get_property(art,(object *)0x0,"damage reduction",uVar5 + L'\x06',true);
      }
      uVar5 = Rand_div(5);
      if ((int)uVar5 < 2) {
        uVar5 = Rand_div(5);
        get_property(art,(object *)0x0,"acid resistance",uVar5 * 5 + L'#',true);
      }
      uVar5 = Rand_div(5);
      if ((int)uVar5 < 2) {
        uVar5 = Rand_div(5);
        get_property(art,(object *)0x0,"electricity resistance",uVar5 * 5 + L'#',true);
      }
      uVar5 = Rand_div(5);
      if ((int)uVar5 < 2) {
        uVar5 = Rand_div(5);
        get_property(art,(object *)0x0,"fire resistance",uVar5 * 5 + L'#',true);
      }
      uVar5 = Rand_div(5);
      if ((int)uVar5 < 2) {
        uVar5 = Rand_div(5);
        get_property(art,(object *)0x0,"cold resistance",uVar5 * 5 + L'#',true);
      }
      uVar5 = Rand_div(6);
      if (uVar5 == 0) {
        wVar11 = lookup_curse("impair hitpoint recovery");
        uVar5 = Rand_div(0x14);
        append_artifact_curse(art,wVar11,uVar5 + L'(');
        potential = potential + L'd';
      }
      break;
    }
    if (uVar5 < 0x4a) {
      uVar5 = Rand_div(3);
      if (uVar5 != 0) {
        uVar5 = Rand_div(2);
        pcVar12 = "RAND_BLESS";
        if (uVar5 == 0) {
          pcVar12 = "RAND_TELEPORT1";
        }
        paVar9 = lookup_activation(pcVar12);
        art->activation = paVar9;
      }
      uVar5 = Rand_div(5);
      get_property(art,(object *)0x0,"dark resistance",uVar5 * 5 + L'#',true);
      uVar5 = Rand_div(4);
      get_property(art,(object *)0x0,"stealth",uVar5 + L'\x01',true);
      get_property(art,(object *)0x0,"see invisible",L'\0',true);
      uVar5 = Rand_div(5);
      if (1 < (int)uVar5) goto LAB_0018fce4;
      uVar5 = Rand_div(5);
      wVar11 = uVar5 * 5 + L'#';
      pcVar12 = "nether resistance";
LAB_00190ec4:
      _Var14 = true;
      goto LAB_0018fcdf;
    }
    if (uVar5 < 0x52) {
      if (wVar11 < L'ৄ') goto LAB_0018fce4;
      uVar5 = Rand_div(3);
      if (uVar5 != 0) {
        paVar9 = lookup_activation("RAND_CURE");
        art->activation = paVar9;
      }
      uVar5 = Rand_div(5);
      wVar11 = uVar5 * 5 + L'#';
      pcVar12 = "poison resistance";
      goto LAB_00190ec4;
    }
    if (uVar5 < 0x5f) {
      uVar5 = Rand_div(3);
      if (uVar5 != 0) {
        pcVar12 = "RAND_LIGHT2";
        if (potential < L'ᆔ') {
          pcVar12 = "RAND_LIGHT1";
        }
        paVar9 = lookup_activation(pcVar12);
        art->activation = paVar9;
      }
      get_property(art,(object *)0x0,"light",L'\x01',true);
      uVar5 = Rand_div(5);
      wVar11 = uVar5 * 5 + L'#';
      pcVar12 = "light resistance";
      goto LAB_00190ec4;
    }
    if (99 < uVar5) break;
    if (wVar11 < L'ᕼ') goto switchD_0019128e_default;
    uVar5 = Rand_div(4);
    switch(uVar5) {
    case 0:
      uVar5 = Rand_div(3);
      if (uVar5 != 0) {
        paVar9 = lookup_activation("RAND_FIRE3");
        art->activation = paVar9;
      }
      get_property(art,(object *)0x0,"fire resistance",L'd',true);
      uVar5 = Rand_div(4);
      if (uVar5 == 0) {
        pcVar12 = "demon summon";
LAB_00191486:
        wVar11 = lookup_curse(pcVar12);
        uVar5 = Rand_div(0x14);
        append_artifact_curse(art,wVar11,uVar5 + L'(');
        potential = potential + L'd';
      }
      break;
    case 1:
      uVar5 = Rand_div(3);
      if (uVar5 != 0) {
        paVar9 = lookup_activation("RAND_COLD3");
        art->activation = paVar9;
      }
      get_property(art,(object *)0x0,"cold resistance",L'd',true);
      uVar5 = Rand_div(4);
      if (uVar5 == 0) {
        pcVar12 = "undead summon";
        goto LAB_00191486;
      }
      break;
    case 2:
      uVar5 = Rand_div(3);
      if (uVar5 != 0) {
        paVar9 = lookup_activation("RAND_ACID3");
        art->activation = paVar9;
      }
      pcVar12 = "acid resistance";
      goto LAB_0019141d;
    case 3:
      uVar5 = Rand_div(3);
      if (uVar5 != 0) {
        paVar9 = lookup_activation("RAND_ELEC3");
        art->activation = paVar9;
      }
      pcVar12 = "electricity resistance";
LAB_0019141d:
      get_property(art,(object *)0x0,pcVar12,L'd',true);
    }
switchD_0019128e_default:
    uVar5 = Rand_div(5);
    if ((int)uVar5 < 2) {
      uVar5 = Rand_div(5);
      get_property(art,(object *)0x0,"acid resistance",uVar5 * 5 + L'#',true);
    }
    uVar5 = Rand_div(5);
    if ((int)uVar5 < 2) {
      uVar5 = Rand_div(5);
      get_property(art,(object *)0x0,"electricity resistance",uVar5 * 5 + L'#',true);
    }
    uVar5 = Rand_div(5);
    if ((int)uVar5 < 2) {
      uVar5 = Rand_div(5);
      get_property(art,(object *)0x0,"fire resistance",uVar5 * 5 + L'#',true);
    }
    uVar5 = Rand_div(5);
    if ((int)uVar5 < 2) {
      uVar5 = Rand_div(5);
      get_property(art,(object *)0x0,"cold resistance",uVar5 * 5 + L'#',true);
    }
    if (art->tval != L'\x12') break;
    iVar16 = potential / 0x9c4;
    uVar5 = Rand_div(2);
    wVar11 = uVar5 + iVar16 + L'\x01';
    pcVar12 = "speed";
LAB_001900f6:
    _Var14 = false;
LAB_001900f9:
    get_property(art,(object *)0x0,pcVar12,wVar11,_Var14);
  }
switchD_00191248_default:
  uVar5 = Rand_div(6);
  if (uVar5 == 0) {
    wVar11 = art->weight;
    uVar5 = Rand_div(2);
    wVar7 = art->weight;
    if (uVar5 == 0) {
      if (L'\x1d' < wVar7) {
        uVar5 = Rand_div((uint)wVar7 / 10);
        wVar7 = uVar5 * 5 + art->weight + L'\n';
        art->weight = wVar7;
        potential = (wVar7 - wVar11) * 10 + potential;
      }
    }
    else if (L'1' < wVar7) {
      uVar5 = Rand_div((uint)wVar7 / 10);
      wVar7 = uVar5 * -5 + art->weight + L'\xfffffff6';
      art->weight = wVar7;
      wVar11 = potential + (wVar11 - wVar7) * -10;
      potential = L'\0';
      if (L'\0' < wVar11) {
        potential = wVar11;
      }
    }
  }
  return;
}

Assistant:

static void choose_artifact_theme(struct artifact *art)
{
	struct object_kind *kind = lookup_kind(art->tval, art->sval);

	/* Possibly make very powerful artifacts cursed. */
	if ((potential > 6000) && (potential > randint1(30000))) {
		int max_tries;
		for (max_tries = 3; max_tries; max_tries--) {
			int pick = randint1(z_info->curse_max - 1);
			int power = randint1(9) + 10 * m_bonus(9, art->alloc_min);
			if (!curses[pick].poss[art->tval]) continue;
			append_artifact_curse(art, pick, power);
		}
	}

	/* Frequently (but not always) assign a basic theme to the artifact. */
	switch (kind->tval) {
		case TV_SWORD:
		case TV_POLEARM:
		case TV_HAFTED: choose_melee_weapon_theme(art); break;
		case TV_BOW: choose_launcher_theme(art); break;
		case TV_SOFT_ARMOR:
		case TV_HARD_ARMOR:
		case TV_DRAG_ARMOR: choose_armor_theme(art); break;
		case TV_SHIELD: choose_shield_theme(art); break;
		case TV_BOOTS: choose_boots_theme(art); break;
		case TV_CLOAK: choose_cloak_theme(art); break;
		case TV_HELM:
		case TV_CROWN: choose_hat_theme(art); break;
		case TV_GLOVES: choose_gloves_theme(art); break;
		default: msg("error -- object kind not recognized."); break;
	}

	/* It is possible for artifacts to be unusually heavy or light. */
	if (one_in_(6)) {
		int old_weight = art->weight;
		if (one_in_(2) && (art->weight >= 30)) {
			/* Sometimes, they are unusually heavy. */
			art->weight += randint1(art->weight / 10) * 5 + 5;
			potential += (art->weight - old_weight) * 10;
		} else if (art->weight >= 50) {
			/* Sometimes, they are unusually light. */
			art->weight -= randint1(art->weight / 10) * 5 + 5;
			potential -= (old_weight - art->weight) * 10;
			potential = MAX(potential, 0);
		}
	}
}